

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::CreateBeliefLowerBound(BaseTag *this)

{
  string *in_RSI;
  
  CreateBeliefLowerBound
            ((BaseTag *)
             &this[-1].memory_pool_.freelist_.
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RSI);
  return;
}

Assistant:

BeliefLowerBound* BaseTag::CreateBeliefLowerBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefLowerBound(this);
	} else if (name == "DEFAULT" || name == "BLIND") {
		return new TagBlindBeliefPolicy(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}